

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix.c
# Opt level: O0

int enet_address_get_host_ip(ENetAddress *address,char *name,size_t nameLength)

{
  char *__s;
  size_t sVar1;
  size_t addrLen;
  char *addr;
  size_t nameLength_local;
  char *name_local;
  ENetAddress *address_local;
  
  __s = inet_ntoa((in_addr)address->host);
  if (__s == (char *)0x0) {
    address_local._4_4_ = -1;
  }
  else {
    sVar1 = strlen(__s);
    if (sVar1 < nameLength) {
      memcpy(name,__s,sVar1 + 1);
      address_local._4_4_ = 0;
    }
    else {
      address_local._4_4_ = -1;
    }
  }
  return address_local._4_4_;
}

Assistant:

int
enet_address_get_host_ip (const ENetAddress * address, char * name, size_t nameLength)
{
#ifdef HAS_INET_NTOP
    if (inet_ntop (AF_INET, & address -> host, name, nameLength) == NULL)
#else
    char * addr = inet_ntoa (* (struct in_addr *) & address -> host);
    if (addr != NULL)
    {
        size_t addrLen = strlen(addr);
        if (addrLen >= nameLength)
          return -1;
        memcpy (name, addr, addrLen + 1);
    } 
    else
#endif
        return -1;
    return 0;
}